

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

void convert_mods(iasctx *ctx,easm_mods *mods)

{
  int iVar1;
  litem *plVar2;
  litem **pplVar3;
  litem *li;
  int i;
  easm_mods *mods_local;
  iasctx *ctx_local;
  
  for (li._4_4_ = 0; li._4_4_ < mods->modsnum; li._4_4_ = li._4_4_ + 1) {
    plVar2 = (litem *)calloc(0x20,1);
    plVar2->type = LITEM_NAME;
    plVar2->str = mods->mods[li._4_4_]->str;
    if (ctx->atomsmax <= ctx->atomsnum) {
      if (ctx->atomsmax == 0) {
        ctx->atomsmax = 0x10;
      }
      else {
        ctx->atomsmax = ctx->atomsmax << 1;
      }
      pplVar3 = (litem **)realloc(ctx->atoms,(long)ctx->atomsmax << 3);
      ctx->atoms = pplVar3;
    }
    iVar1 = ctx->atomsnum;
    ctx->atomsnum = iVar1 + 1;
    ctx->atoms[iVar1] = plVar2;
  }
  return;
}

Assistant:

void convert_mods(struct iasctx *ctx, struct easm_mods *mods) {
	int i;
	for (i = 0; i < mods->modsnum; i++) {
		struct litem *li = calloc(sizeof *li, 1);
		li->type = LITEM_NAME;
		li->str = mods->mods[i]->str;
		ADDARRAY(ctx->atoms, li);
	}
}